

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview_p.h
# Opt level: O1

bool __thiscall QListViewItem::operator==(QListViewItem *this,QListViewItem *other)

{
  undefined1 auVar1 [16];
  
  auVar1[0] = -((char)other->x == (char)this->x);
  auVar1[1] = -(*(char *)((long)&other->x + 1) == *(char *)((long)&this->x + 1));
  auVar1[2] = -(*(char *)((long)&other->x + 2) == *(char *)((long)&this->x + 2));
  auVar1[3] = -(*(char *)((long)&other->x + 3) == *(char *)((long)&this->x + 3));
  auVar1[4] = -((char)other->y == (char)this->y);
  auVar1[5] = -(*(char *)((long)&other->y + 1) == *(char *)((long)&this->y + 1));
  auVar1[6] = -(*(char *)((long)&other->y + 2) == *(char *)((long)&this->y + 2));
  auVar1[7] = -(*(char *)((long)&other->y + 3) == *(char *)((long)&this->y + 3));
  auVar1[8] = -((char)other->w == (char)this->w);
  auVar1[9] = -(*(char *)((long)&other->w + 1) == *(char *)((long)&this->w + 1));
  auVar1[10] = -((char)other->h == (char)this->h);
  auVar1[0xb] = -(*(char *)((long)&other->h + 1) == *(char *)((long)&this->h + 1));
  auVar1[0xc] = -((char)other->indexHint == (char)this->indexHint);
  auVar1[0xd] = -(*(char *)((long)&other->indexHint + 1) == *(char *)((long)&this->indexHint + 1));
  auVar1[0xe] = -(*(char *)((long)&other->indexHint + 2) == *(char *)((long)&this->indexHint + 2));
  auVar1[0xf] = -(*(char *)((long)&other->indexHint + 3) == *(char *)((long)&this->indexHint + 3));
  return (ushort)((ushort)(SUB161(auVar1 >> 7,0) & 1) | (ushort)(SUB161(auVar1 >> 0xf,0) & 1) << 1 |
                  (ushort)(SUB161(auVar1 >> 0x17,0) & 1) << 2 |
                  (ushort)(SUB161(auVar1 >> 0x1f,0) & 1) << 3 |
                  (ushort)(SUB161(auVar1 >> 0x27,0) & 1) << 4 |
                  (ushort)(SUB161(auVar1 >> 0x2f,0) & 1) << 5 |
                  (ushort)(SUB161(auVar1 >> 0x37,0) & 1) << 6 |
                  (ushort)(SUB161(auVar1 >> 0x3f,0) & 1) << 7 |
                  (ushort)(SUB161(auVar1 >> 0x47,0) & 1) << 8 |
                  (ushort)(SUB161(auVar1 >> 0x4f,0) & 1) << 9 |
                  (ushort)(SUB161(auVar1 >> 0x57,0) & 1) << 10 |
                  (ushort)(SUB161(auVar1 >> 0x5f,0) & 1) << 0xb |
                  (ushort)(SUB161(auVar1 >> 0x67,0) & 1) << 0xc |
                  (ushort)(SUB161(auVar1 >> 0x6f,0) & 1) << 0xd |
                  (ushort)(SUB161(auVar1 >> 0x77,0) & 1) << 0xe | (ushort)(auVar1[0xf] >> 7) << 0xf)
         == 0xffff;
}

Assistant:

constexpr bool operator==(const QListViewItem &other) const {
        return (x == other.x && y == other.y && w == other.w && h == other.h &&
                indexHint == other.indexHint); }